

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall kratos::IRVisitor::visit_generator_root(IRVisitor *this,Generator *generator)

{
  bool bVar1;
  __shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  shared_ptr<kratos::Generator> *child;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *__range1;
  undefined1 local_30 [8];
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  children;
  Generator *generator_local;
  IRVisitor *this_local;
  
  children.
  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)generator;
  Generator::get_child_generators
            ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
              *)local_30,generator);
  Generator::accept_generator
            ((Generator *)
             children.
             super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
  this->level = this->level + 1;
  __end1 = std::
           vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           ::begin((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                    *)local_30);
  child = (shared_ptr<kratos::Generator> *)
          std::
          vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
          ::end((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                 *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
                                *)&child);
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
               ::operator*(&__end1)->
               super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>;
    peVar2 = std::__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    (*this->_vptr_IRVisitor[2])(this,peVar2);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
    ::operator++(&__end1);
  }
  this->level = this->level - 1;
  std::
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           *)local_30);
  return;
}

Assistant:

void IRVisitor::visit_generator_root(Generator *generator) {
    auto children = generator->get_child_generators();
    generator->accept_generator(this);
    level++;
    for (auto &child : children) visit_generator_root(child.get());
    level--;
}